

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryMappedFile.cpp
# Opt level: O0

MemoryMappedFile * __thiscall
MemoryMappedFile::operator=(MemoryMappedFile *this,MemoryMappedFile *f_other)

{
  MemoryMappedFile *f_other_local;
  MemoryMappedFile *this_local;
  
  this->mpMapped = f_other->mpMapped;
  f_other->mpMapped = (void *)0x0;
  Path::operator=(&this->mFilename,&f_other->mFilename);
  String::clear(&(f_other->mFilename).super_String);
  this->mAccessType = f_other->mAccessType;
  f_other->mAccessType = NO_ACCESS;
  this->mFd = f_other->mFd;
  f_other->mFd = -1;
  this->mFileSize = f_other->mFileSize;
  f_other->mFileSize = 0;
  return this;
}

Assistant:

MemoryMappedFile &MemoryMappedFile::operator=(MemoryMappedFile &&f_other)
{
    mpMapped = f_other.mpMapped;
    f_other.mpMapped = nullptr;

    mFilename = f_other.mFilename;
    f_other.mFilename.clear();

    mAccessType = f_other.mAccessType;
    f_other.mAccessType = NO_ACCESS;

#ifdef _WIN32
    mhFile = f_other.mhFile;
    f_other.mhFile = INVALID_HANDLE_VALUE;

    mhFileMapping = f_other.mhFileMapping;
    f_other.mhFileMapping = INVALID_HANDLE_VALUE;

    mFileSize = f_other.mFileSize;
    f_other.mFileSize = 0;
#else
    mFd = f_other.mFd;
    f_other.mFd = -1;

    mFileSize = f_other.mFileSize;
    f_other.mFileSize = 0;
#endif

    return *this;
}